

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymmetricAlgorithm.cpp
# Opt level: O0

void __thiscall SymmetricAlgorithm::SymmetricAlgorithm(SymmetricAlgorithm *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__SymmetricAlgorithm_00221ae8;
  ByteString::ByteString((ByteString *)0x1a991a);
  in_RDI[1] = 0;
  *(undefined4 *)(in_RDI + 2) = 0;
  *(undefined1 *)((long)in_RDI + 0x14) = 1;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  *(undefined4 *)(in_RDI + 5) = 0;
  in_RDI[6] = 0;
  return;
}

Assistant:

SymmetricAlgorithm::SymmetricAlgorithm()
{
	currentKey = NULL;
	currentCipherMode = SymMode::Unknown;
	currentPaddingMode = true;
	currentCounterBits = 0;
	currentTagBytes = 0;
	currentOperation = NONE;
	currentBufferSize = 0;
}